

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

MockSpec<void_(SDL_Surface_*)> * __thiscall
testing::internal::FunctionMocker<void_(SDL_Surface_*)>::With
          (MockSpec<void_(SDL_Surface_*)> *__return_storage_ptr__,
          FunctionMocker<void_(SDL_Surface_*)> *this,Matcher<SDL_Surface_*> *m)

{
  tuple<testing::Matcher<SDL_Surface_*>_> local_38;
  Matcher<SDL_Surface_*> *local_20;
  Matcher<SDL_Surface_*> *m_local;
  FunctionMocker<void_(SDL_Surface_*)> *this_local;
  
  local_20 = m;
  m_local = (Matcher<SDL_Surface_*> *)this;
  this_local = (FunctionMocker<void_(SDL_Surface_*)> *)__return_storage_ptr__;
  std::make_tuple<testing::Matcher<SDL_Surface*>>(&local_38,m);
  MockSpec<void_(SDL_Surface_*)>::MockSpec(__return_storage_ptr__,this,&local_38);
  std::tuple<testing::Matcher<SDL_Surface_*>_>::~tuple(&local_38);
  return __return_storage_ptr__;
}

Assistant:

MockSpec<F> With(Matcher<Args>... m) {
    return MockSpec<F>(this, ::std::make_tuple(std::move(m)...));
  }